

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O0

double dzasum(int n,complex<double> *x,int incx)

{
  double dVar1;
  double dVar2;
  double local_38;
  double value;
  int local_28;
  int ix;
  int i;
  int incx_local;
  complex<double> *x_local;
  double dStack_10;
  int n_local;
  
  local_38 = 0.0;
  if ((n < 1) || (incx < 1)) {
    dStack_10 = 0.0;
  }
  else {
    if (incx == 1) {
      for (local_28 = 0; local_28 < n; local_28 = local_28 + 1) {
        dVar1 = std::real<double>(x + local_28);
        dVar2 = std::imag<double>(x + local_28);
        local_38 = local_38 + ABS(dVar1) + ABS(dVar2);
      }
    }
    else {
      value._4_4_ = 0;
      for (local_28 = 0; local_28 < n; local_28 = local_28 + 1) {
        dVar1 = std::real<double>(x + value._4_4_);
        dVar2 = std::imag<double>(x + value._4_4_);
        local_38 = local_38 + ABS(dVar1) + ABS(dVar2);
        value._4_4_ = value._4_4_ + incx;
      }
    }
    dStack_10 = local_38;
  }
  return dStack_10;
}

Assistant:

double dzasum ( int n, complex <double> x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    DZASUM takes the sum of the absolute values of a complex <double> vector.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <double> X[], the vector.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Output, double DZASUM, the sum of the absolute values.
//
{
  int i;
  int ix;
  double value;

  value = 0.0;

  if ( n <= 0 || incx <= 0 )
  {
    return value;
  }

  if ( incx == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      value = value + fabs ( real ( x[i] ) )
                    + fabs ( imag ( x[i] ) );
    }
  }
  else
  {
    ix = 0;
    for ( i = 0; i < n; i++ )
    {
      value = value + fabs ( real ( x[ix] ) )
                    + fabs ( imag ( x[ix] ) );
      ix = ix + incx;
    }
  }
  return value;
}